

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *pBVar3;
  undefined8 *puVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  seqDef *psVar7;
  undefined8 uVar8;
  uint uVar9;
  BYTE *pStart_1;
  ulong *puVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  ulong *puVar13;
  byte bVar14;
  uint uVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong *puVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 *puVar31;
  int iVar32;
  long lVar33;
  BYTE *pBVar34;
  ulong *puVar35;
  uint uVar36;
  BYTE *pInLoopLimit_7;
  ulong *puVar37;
  BYTE *pBVar38;
  ulong *puVar39;
  ulong uVar40;
  void *pvVar41;
  undefined1 *puVar42;
  int iVar43;
  BYTE *litEnd;
  ulong *puVar44;
  U32 *hashTable;
  BYTE *litLimit_w_10;
  BYTE *base;
  BYTE *istart;
  BYTE *ilimit;
  BYTE *pInLoopLimit;
  U32 prefixStartIndex;
  BYTE *pInLoopLimit_14;
  BYTE *litLimit_w;
  BYTE *litLimit_w_4;
  BYTE *iend;
  size_t stepSize;
  BYTE *prefixStart;
  ulong *local_e8;
  ulong *local_d8;
  ulong *local_c8;
  BYTE *local_c0;
  U32 local_b8;
  ulong *local_a0;
  ulong local_98;
  ulong *local_80;
  BYTE *local_78;
  uint local_70;
  
  uVar15 = (ms->cParams).minMatch;
  uVar9 = (ms->cParams).targetLength;
  pUVar5 = ms->hashTable;
  local_d8 = (ulong *)src;
  if (1 < uVar9) {
    pBVar6 = (ms->window).base;
    puVar2 = (ulong *)((long)src + srcSize);
    iVar32 = (int)pBVar6;
    iVar43 = (int)puVar2 - iVar32;
    uVar36 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar23 = (ms->window).dictLimit;
    uVar19 = iVar43 - uVar36;
    if (iVar43 - uVar23 <= uVar36) {
      uVar19 = uVar23;
    }
    if (ms->loadedDictEnd != 0) {
      uVar19 = uVar23;
    }
    pBVar34 = pBVar6 + uVar19;
    puVar44 = (ulong *)((ulong)(pBVar34 == (BYTE *)src) + (long)src);
    iVar43 = (int)puVar44 - iVar32;
    uVar21 = iVar43 - uVar36;
    if (iVar43 - uVar23 <= uVar36) {
      uVar21 = uVar23;
    }
    if (ms->loadedDictEnd != 0) {
      uVar21 = uVar23;
    }
    uVar27 = (ulong)(uVar9 + 1);
    uVar9 = *rep;
    uVar23 = rep[1];
    uVar21 = iVar43 - uVar21;
    local_98._0_4_ = uVar23;
    if (uVar21 < uVar23) {
      local_98._0_4_ = 0;
    }
    uVar40 = (ulong)(uint)local_98;
    uVar36 = 0;
    if (uVar9 <= uVar21) {
      uVar36 = uVar9;
    }
    uVar20 = (ulong)uVar36;
    puVar37 = (ulong *)((long)src + (srcSize - 8));
    puVar35 = (ulong *)((long)puVar44 + uVar27);
    puVar10 = (ulong *)((long)puVar44 + uVar27 + 1);
    if (uVar15 == 5) {
      if (puVar10 < puVar37) {
        bVar14 = 0x40 - (char)(ms->cParams).hashLog;
        puVar1 = (ulong *)((long)puVar2 - 7);
        puVar16 = puVar2 + -4;
        uVar24 = uVar27;
        local_d8 = (ulong *)src;
        do {
          uVar26 = *puVar44 * -0x30e4432345000000 >> (bVar14 & 0x3f);
          local_e8 = puVar44 + 0x10;
          uVar29 = (ulong)pUVar5[uVar26];
          uVar36 = (uint)uVar20;
          lVar33 = -uVar20;
          uVar28 = (ulong)(*(long *)((long)puVar44 + 1) * -0x30e4432345000000) >> (bVar14 & 0x3f);
          puVar17 = (ulong *)((long)puVar44 + 1);
          local_a0 = (ulong *)uVar27;
          while( true ) {
            uVar22 = (int)puVar44 - iVar32;
            uVar15 = *(uint *)((long)puVar35 + lVar33);
            pUVar5[uVar26] = uVar22;
            iVar43 = (int)puVar17;
            puVar25 = puVar35;
            puVar13 = puVar10;
            if ((uVar36 == 0) || ((uint)*puVar35 != uVar15)) {
              if ((uint)uVar29 < uVar19) {
                uVar15 = (uint)*puVar44 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar6 + uVar29);
              }
              if ((uint)*puVar44 == uVar15) {
                pUVar5[uVar28] = iVar43 - iVar32;
                iVar43 = 9;
              }
              else {
                uVar15 = pUVar5[uVar28];
                uVar29 = (ulong)uVar15;
                uVar30 = *puVar35 * -0x30e4432345000000 >> (bVar14 & 0x3f);
                uVar22 = iVar43 - iVar32;
                pUVar5[uVar28] = uVar22;
                if (uVar15 < uVar19) {
                  uVar15 = (uint)*puVar17 ^ 1;
                }
                else {
                  uVar15 = *(uint *)(pBVar6 + uVar29);
                }
                if ((uint)*puVar17 == uVar15) {
                  iVar43 = 9;
                  puVar25 = puVar10;
                  puVar44 = puVar17;
                  uVar26 = uVar28;
                  uVar28 = uVar30;
                  puVar17 = puVar35;
                  if (local_a0 < 5) {
                    pUVar5[uVar30] = (int)puVar35 - iVar32;
                  }
                }
                else {
                  uVar29 = (ulong)pUVar5[uVar30];
                  uVar28 = *puVar10 * -0x30e4432345000000 >> (bVar14 & 0x3f);
                  puVar25 = (ulong *)((long)puVar35 + (long)local_a0);
                  puVar13 = (ulong *)((long)puVar10 + (long)local_a0);
                  iVar43 = 0;
                  puVar44 = puVar35;
                  uVar26 = uVar30;
                  puVar17 = puVar10;
                  if (local_e8 <= puVar25) {
                    local_a0 = (ulong *)((long)local_a0 + 1);
                    local_e8 = local_e8 + 0x10;
                  }
                }
              }
            }
            else {
              uVar24 = (ulong)(*(char *)((long)puVar35 + -1) ==
                              *(char *)((long)puVar35 + lVar33 + -1));
              puVar44 = (ulong *)((long)puVar35 - uVar24);
              local_78 = (BYTE *)((long)puVar35 + (lVar33 - uVar24));
              uVar24 = uVar24 | 4;
              pUVar5[uVar28] = iVar43 - iVar32;
              iVar43 = 8;
              local_b8 = 1;
            }
            puVar10 = puVar13;
            if (iVar43 != 0) break;
            puVar35 = puVar25;
            local_98 = uVar40;
            if (puVar37 <= puVar10) goto LAB_01db6d72;
          }
          local_e8 = (ulong *)uVar20;
          if (iVar43 != 8) {
            local_78 = pBVar6 + uVar29;
            uVar15 = (int)puVar44 - (int)local_78;
            local_e8 = (ulong *)(ulong)uVar15;
            local_b8 = uVar15 + 3;
            uVar24 = 4;
            uVar40 = uVar20;
            if ((uVar19 < (uint)uVar29) && (local_d8 < puVar44)) {
              pBVar38 = pBVar6 + (uVar29 - 1);
              puVar35 = puVar44;
              while (local_78 = pBVar38, puVar44 = (ulong *)((long)puVar35 + -1),
                    *(BYTE *)puVar44 == *local_78) {
                uVar24 = uVar24 + 1;
                if ((puVar44 <= local_d8) ||
                   (pBVar38 = local_78 + -1, puVar35 = puVar44, local_78 <= pBVar34))
                goto LAB_01db5c38;
              }
              local_78 = local_78 + 1;
              puVar44 = puVar35;
            }
          }
LAB_01db5c38:
          puVar35 = (ulong *)((long)puVar44 + uVar24);
          puVar10 = (ulong *)(local_78 + uVar24);
          puVar17 = puVar35;
          if (puVar35 < puVar1) {
            uVar26 = *puVar35 ^ *puVar10;
            uVar20 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar20 = uVar20 >> 3 & 0x1fffffff;
            if (*puVar10 == *puVar35) {
              do {
                puVar17 = puVar17 + 1;
                puVar10 = puVar10 + 1;
                if (puVar1 <= puVar17) goto LAB_01db5caa;
                uVar26 = *puVar17 ^ *puVar10;
                uVar20 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                uVar20 = (long)puVar17 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar35);
              } while (*puVar10 == *puVar17);
            }
          }
          else {
LAB_01db5caa:
            if ((puVar17 < (ulong *)((long)puVar2 - 3U)) && ((uint)*puVar10 == (uint)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar10 = (ulong *)((long)puVar10 + 4);
            }
            if ((puVar17 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar10 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar10 = (ulong *)((long)puVar10 + 2);
            }
            if (puVar17 < puVar2) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar10 == (char)*puVar17));
            }
            uVar20 = (long)puVar17 - (long)puVar35;
          }
          uVar26 = (long)puVar44 - (long)local_d8;
          puVar35 = (ulong *)seqStore->lit;
          if (puVar16 < puVar44) {
            ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)local_d8,(BYTE *)puVar44,(BYTE *)puVar16);
          }
          else {
            uVar28 = local_d8[1];
            *puVar35 = *local_d8;
            puVar35[1] = uVar28;
            if (0x10 < uVar26) {
              pBVar38 = seqStore->lit;
              uVar28 = local_d8[3];
              *(ulong *)(pBVar38 + 0x10) = local_d8[2];
              *(ulong *)(pBVar38 + 0x18) = uVar28;
              if (0x20 < (long)uVar26) {
                lVar33 = 0;
                do {
                  puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x20);
                  uVar8 = puVar4[1];
                  pBVar12 = pBVar38 + lVar33 + 0x20;
                  *(undefined8 *)pBVar12 = *puVar4;
                  *(undefined8 *)(pBVar12 + 8) = uVar8;
                  puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x30);
                  uVar8 = puVar4[1];
                  *(undefined8 *)(pBVar12 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar12 + 0x18) = uVar8;
                  lVar33 = lVar33 + 0x20;
                } while (pBVar12 + 0x20 < pBVar38 + uVar26);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar26;
          if (0xffff < uVar26) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar24 = uVar20 + uVar24;
          psVar7 = seqStore->sequences;
          psVar7->litLength = (U16)uVar26;
          psVar7->offBase = local_b8;
          if (0xffff < uVar24 - 3) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar7->mlBase = (U16)(uVar24 - 3);
          seqStore->sequences = psVar7 + 1;
          puVar44 = (ulong *)((long)puVar44 + uVar24);
          if (puVar44 <= puVar37) {
            pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar22 + 2) * -0x30e4432345000000) >>
                   (bVar14 & 0x3f)] = uVar22 + 2;
            pUVar5[(ulong)(*(long *)((long)puVar44 + -2) * -0x30e4432345000000) >> (bVar14 & 0x3f)]
                 = ((int)puVar44 + -2) - iVar32;
            if ((int)uVar40 == 0) {
              uVar40 = 0;
            }
            else {
              do {
                uVar26 = (ulong)local_e8;
                uVar20 = uVar40;
                local_e8 = (ulong *)uVar26;
                uVar40 = uVar20;
                if ((uint)*puVar44 != *(uint *)((long)puVar44 - uVar20)) break;
                puVar35 = (ulong *)((long)puVar44 + 4);
                puVar17 = (ulong *)((long)puVar44 + (4 - uVar20));
                puVar10 = puVar35;
                if (puVar35 < puVar1) {
                  uVar28 = *puVar35 ^ *puVar17;
                  uVar40 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar40 = uVar40 >> 3 & 0x1fffffff;
                  if (*puVar17 == *puVar35) {
                    puVar10 = (ulong *)((long)puVar44 + 0xc);
                    puVar17 = (ulong *)((long)puVar44 + (0xc - uVar20));
                    do {
                      if (puVar1 <= puVar10) goto LAB_01db5ee1;
                      uVar28 = *puVar17;
                      uVar29 = *puVar10;
                      uVar30 = uVar29 ^ uVar28;
                      uVar40 = 0;
                      if (uVar30 != 0) {
                        for (; (uVar30 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar40 = (long)puVar10 + ((uVar40 >> 3 & 0x1fffffff) - (long)puVar35);
                      puVar10 = puVar10 + 1;
                      puVar17 = puVar17 + 1;
                    } while (uVar28 == uVar29);
                  }
                }
                else {
LAB_01db5ee1:
                  if ((puVar10 < (ulong *)((long)puVar2 - 3U)) && ((uint)*puVar17 == (uint)*puVar10)
                     ) {
                    puVar10 = (ulong *)((long)puVar10 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar10 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar17 == (short)*puVar10)) {
                    puVar10 = (ulong *)((long)puVar10 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar10 < puVar2) {
                    puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar17 == (char)*puVar10));
                  }
                  uVar40 = (long)puVar10 - (long)puVar35;
                }
                pUVar5[*puVar44 * -0x30e4432345000000 >> (bVar14 & 0x3f)] = (int)puVar44 - iVar32;
                puVar35 = (ulong *)seqStore->lit;
                if (puVar16 < puVar44) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar35,(BYTE *)puVar44,(BYTE *)puVar44,(BYTE *)puVar16);
                }
                else {
                  uVar28 = puVar44[1];
                  *puVar35 = *puVar44;
                  puVar35[1] = uVar28;
                }
                psVar7 = seqStore->sequences;
                psVar7->litLength = 0;
                psVar7->offBase = 1;
                if (0xffff < uVar40 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar44 = (ulong *)((long)puVar44 + uVar40 + 4);
                psVar7->mlBase = (U16)(uVar40 + 1);
                seqStore->sequences = psVar7 + 1;
                local_e8 = (ulong *)uVar20;
                uVar40 = uVar26;
              } while (puVar44 <= puVar37);
            }
          }
          uVar36 = (uint)local_e8;
          local_98._0_4_ = (uint)uVar40;
          puVar35 = (ulong *)((long)puVar44 + uVar27);
          puVar10 = (ulong *)((long)puVar44 + uVar27 + 1);
          uVar20 = (ulong)local_e8;
          local_d8 = puVar44;
        } while (puVar10 < puVar37);
      }
    }
    else if (uVar15 == 6) {
      if (puVar10 < puVar37) {
        bVar14 = 0x40 - (char)(ms->cParams).hashLog;
        puVar1 = (ulong *)((long)puVar2 - 7);
        puVar16 = puVar2 + -4;
        pvVar41 = src;
        local_d8 = (ulong *)src;
        do {
          uVar24 = *puVar44 * -0x30e4432340650000 >> (bVar14 & 0x3f);
          local_80 = puVar44 + 0x10;
          uVar28 = (ulong)pUVar5[uVar24];
          uVar36 = (uint)uVar20;
          lVar33 = -uVar20;
          uVar26 = (ulong)(*(long *)((long)puVar44 + 1) * -0x30e4432340650000) >> (bVar14 & 0x3f);
          puVar17 = (ulong *)((long)puVar44 + 1);
          local_e8 = (ulong *)uVar27;
          while( true ) {
            uVar22 = (int)puVar44 - iVar32;
            uVar15 = *(uint *)((long)puVar35 + lVar33);
            pUVar5[uVar24] = uVar22;
            iVar43 = (int)puVar17;
            puVar25 = puVar35;
            puVar18 = puVar17;
            puVar13 = puVar10;
            if ((uVar36 == 0) || ((uint)*puVar35 != uVar15)) {
              if ((uint)uVar28 < uVar19) {
                uVar15 = (uint)*puVar44 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar6 + uVar28);
              }
              if ((uint)*puVar44 == uVar15) {
                pUVar5[uVar26] = iVar43 - iVar32;
                iVar43 = 9;
              }
              else {
                uVar15 = pUVar5[uVar26];
                uVar28 = (ulong)uVar15;
                uVar29 = *puVar35 * -0x30e4432340650000 >> (bVar14 & 0x3f);
                uVar22 = iVar43 - iVar32;
                pUVar5[uVar26] = uVar22;
                if (uVar15 < uVar19) {
                  uVar15 = (uint)*puVar17 ^ 1;
                }
                else {
                  uVar15 = *(uint *)(pBVar6 + uVar28);
                }
                if ((uint)*puVar17 == uVar15) {
                  iVar43 = 9;
                  puVar25 = puVar10;
                  uVar24 = uVar26;
                  puVar18 = puVar35;
                  uVar26 = uVar29;
                  puVar44 = puVar17;
                  if (local_e8 < 5) {
                    pUVar5[uVar29] = (int)puVar35 - iVar32;
                  }
                }
                else {
                  uVar28 = (ulong)pUVar5[uVar29];
                  uVar26 = *puVar10 * -0x30e4432340650000 >> (bVar14 & 0x3f);
                  puVar25 = (ulong *)((long)puVar35 + (long)local_e8);
                  puVar13 = (ulong *)((long)puVar10 + (long)local_e8);
                  iVar43 = 0;
                  uVar24 = uVar29;
                  puVar18 = puVar10;
                  puVar44 = puVar35;
                  if (local_80 <= puVar25) {
                    local_e8 = (ulong *)((long)local_e8 + 1);
                    local_80 = local_80 + 0x10;
                  }
                }
              }
            }
            else {
              uVar29 = (ulong)(*(char *)((long)puVar35 + -1) ==
                              *(char *)((long)puVar35 + lVar33 + -1));
              puVar44 = (ulong *)((long)puVar35 - uVar29);
              local_78 = (BYTE *)((long)puVar35 + (lVar33 - uVar29));
              pvVar41 = (void *)(uVar29 | 4);
              pUVar5[uVar26] = iVar43 - iVar32;
              iVar43 = 8;
              local_b8 = 1;
            }
            puVar10 = puVar13;
            if (iVar43 != 0) break;
            puVar35 = puVar25;
            puVar17 = puVar18;
            local_98 = uVar40;
            if (puVar37 <= puVar10) goto LAB_01db6d72;
          }
          local_e8 = (ulong *)uVar20;
          if (iVar43 != 8) {
            local_78 = pBVar6 + uVar28;
            uVar15 = (int)puVar44 - (int)local_78;
            local_e8 = (ulong *)(ulong)uVar15;
            local_b8 = uVar15 + 3;
            pvVar41 = (void *)0x4;
            uVar40 = uVar20;
            if ((uVar19 < (uint)uVar28) && (local_d8 < puVar44)) {
              pBVar38 = pBVar6 + (uVar28 - 1);
              puVar35 = puVar44;
              while (local_78 = pBVar38, puVar44 = (ulong *)((long)puVar35 + -1),
                    *(BYTE *)puVar44 == *local_78) {
                pvVar41 = (void *)((long)pvVar41 + 1);
                if ((puVar44 <= local_d8) ||
                   (pBVar38 = local_78 + -1, puVar35 = puVar44, local_78 <= pBVar34))
                goto LAB_01db4eae;
              }
              local_78 = local_78 + 1;
              puVar44 = puVar35;
            }
          }
LAB_01db4eae:
          puVar35 = (ulong *)((long)puVar44 + (long)pvVar41);
          puVar17 = (ulong *)(local_78 + (long)pvVar41);
          puVar10 = puVar35;
          if (puVar35 < puVar1) {
            uVar24 = *puVar35 ^ *puVar17;
            uVar20 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar20 = uVar20 >> 3 & 0x1fffffff;
            if (*puVar17 == *puVar35) {
              do {
                puVar10 = puVar10 + 1;
                puVar17 = puVar17 + 1;
                if (puVar1 <= puVar10) goto LAB_01db4f27;
                uVar24 = *puVar10 ^ *puVar17;
                uVar20 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                uVar20 = (long)puVar10 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar35);
              } while (*puVar17 == *puVar10);
            }
          }
          else {
LAB_01db4f27:
            if ((puVar10 < (ulong *)((long)puVar2 - 3U)) && ((uint)*puVar17 == (uint)*puVar10)) {
              puVar10 = (ulong *)((long)puVar10 + 4);
              puVar17 = (ulong *)((long)puVar17 + 4);
            }
            if ((puVar10 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar17 == (short)*puVar10)) {
              puVar10 = (ulong *)((long)puVar10 + 2);
              puVar17 = (ulong *)((long)puVar17 + 2);
            }
            if (puVar10 < puVar2) {
              puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar17 == (char)*puVar10));
            }
            uVar20 = (long)puVar10 - (long)puVar35;
          }
          uVar24 = (long)puVar44 - (long)local_d8;
          puVar35 = (ulong *)seqStore->lit;
          if (puVar16 < puVar44) {
            ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)local_d8,(BYTE *)puVar44,(BYTE *)puVar16);
          }
          else {
            uVar26 = local_d8[1];
            *puVar35 = *local_d8;
            puVar35[1] = uVar26;
            if (0x10 < uVar24) {
              pBVar38 = seqStore->lit;
              uVar26 = local_d8[3];
              *(ulong *)(pBVar38 + 0x10) = local_d8[2];
              *(ulong *)(pBVar38 + 0x18) = uVar26;
              if (0x20 < (long)uVar24) {
                lVar33 = 0;
                do {
                  puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x20);
                  uVar8 = puVar4[1];
                  pBVar12 = pBVar38 + lVar33 + 0x20;
                  *(undefined8 *)pBVar12 = *puVar4;
                  *(undefined8 *)(pBVar12 + 8) = uVar8;
                  puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x30);
                  uVar8 = puVar4[1];
                  *(undefined8 *)(pBVar12 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar12 + 0x18) = uVar8;
                  lVar33 = lVar33 + 0x20;
                } while (pBVar12 + 0x20 < pBVar38 + uVar24);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar24;
          if (0xffff < uVar24) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          pvVar41 = (void *)(uVar20 + (long)pvVar41);
          psVar7 = seqStore->sequences;
          psVar7->litLength = (U16)uVar24;
          psVar7->offBase = local_b8;
          if (0xffff < (long)pvVar41 - 3U) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar7->mlBase = (U16)((long)pvVar41 - 3U);
          seqStore->sequences = psVar7 + 1;
          puVar44 = (ulong *)((long)puVar44 + (long)pvVar41);
          if (puVar44 <= puVar37) {
            pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar22 + 2) * -0x30e4432340650000) >>
                   (bVar14 & 0x3f)] = uVar22 + 2;
            pUVar5[(ulong)(*(long *)((long)puVar44 + -2) * -0x30e4432340650000) >> (bVar14 & 0x3f)]
                 = ((int)puVar44 + -2) - iVar32;
            if ((int)uVar40 == 0) {
              uVar40 = 0;
            }
            else {
              do {
                uVar24 = (ulong)local_e8;
                uVar20 = uVar40;
                local_e8 = (ulong *)uVar24;
                uVar40 = uVar20;
                if ((uint)*puVar44 != *(uint *)((long)puVar44 - uVar20)) break;
                puVar35 = (ulong *)((long)puVar44 + 4);
                puVar17 = (ulong *)((long)puVar44 + (4 - uVar20));
                puVar10 = puVar35;
                if (puVar35 < puVar1) {
                  uVar26 = *puVar35 ^ *puVar17;
                  uVar40 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar40 = uVar40 >> 3 & 0x1fffffff;
                  if (*puVar17 == *puVar35) {
                    puVar10 = (ulong *)((long)puVar44 + 0xc);
                    puVar17 = (ulong *)((long)puVar44 + (0xc - uVar20));
                    do {
                      if (puVar1 <= puVar10) goto LAB_01db514a;
                      uVar26 = *puVar17;
                      uVar28 = *puVar10;
                      uVar29 = uVar28 ^ uVar26;
                      uVar40 = 0;
                      if (uVar29 != 0) {
                        for (; (uVar29 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar40 = (long)puVar10 + ((uVar40 >> 3 & 0x1fffffff) - (long)puVar35);
                      puVar10 = puVar10 + 1;
                      puVar17 = puVar17 + 1;
                    } while (uVar26 == uVar28);
                  }
                }
                else {
LAB_01db514a:
                  if ((puVar10 < (ulong *)((long)puVar2 - 3U)) && ((uint)*puVar17 == (uint)*puVar10)
                     ) {
                    puVar10 = (ulong *)((long)puVar10 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar10 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar17 == (short)*puVar10)) {
                    puVar10 = (ulong *)((long)puVar10 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar10 < puVar2) {
                    puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar17 == (char)*puVar10));
                  }
                  uVar40 = (long)puVar10 - (long)puVar35;
                }
                pUVar5[*puVar44 * -0x30e4432340650000 >> (bVar14 & 0x3f)] = (int)puVar44 - iVar32;
                puVar35 = (ulong *)seqStore->lit;
                if (puVar16 < puVar44) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar35,(BYTE *)puVar44,(BYTE *)puVar44,(BYTE *)puVar16);
                }
                else {
                  uVar26 = puVar44[1];
                  *puVar35 = *puVar44;
                  puVar35[1] = uVar26;
                }
                psVar7 = seqStore->sequences;
                psVar7->litLength = 0;
                psVar7->offBase = 1;
                if (0xffff < uVar40 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar44 = (ulong *)((long)puVar44 + uVar40 + 4);
                psVar7->mlBase = (U16)(uVar40 + 1);
                seqStore->sequences = psVar7 + 1;
                local_e8 = (ulong *)uVar20;
                uVar40 = uVar24;
              } while (puVar44 <= puVar37);
            }
          }
          uVar36 = (uint)local_e8;
          local_98._0_4_ = (uint)uVar40;
          puVar35 = (ulong *)((long)puVar44 + uVar27);
          puVar10 = (ulong *)((long)puVar44 + uVar27 + 1);
          uVar20 = (ulong)local_e8;
          local_d8 = puVar44;
        } while (puVar10 < puVar37);
      }
    }
    else if (uVar15 == 7) {
      if (puVar10 < puVar37) {
        bVar14 = 0x40 - (char)(ms->cParams).hashLog;
        puVar1 = (ulong *)((long)puVar2 - 7);
        puVar16 = puVar2 + -4;
        pvVar41 = src;
        local_d8 = (ulong *)src;
        do {
          uVar24 = *puVar44 * -0x30e44323405a9d00 >> (bVar14 & 0x3f);
          local_80 = puVar44 + 0x10;
          uVar28 = (ulong)pUVar5[uVar24];
          uVar36 = (uint)uVar20;
          lVar33 = -uVar20;
          uVar26 = (ulong)(*(long *)((long)puVar44 + 1) * -0x30e44323405a9d00) >> (bVar14 & 0x3f);
          puVar17 = (ulong *)((long)puVar44 + 1);
          local_e8 = (ulong *)uVar27;
          while( true ) {
            uVar22 = (int)puVar44 - iVar32;
            uVar15 = *(uint *)((long)puVar35 + lVar33);
            pUVar5[uVar24] = uVar22;
            iVar43 = (int)puVar17;
            puVar25 = puVar35;
            puVar18 = puVar17;
            puVar13 = puVar10;
            if ((uVar36 == 0) || ((uint)*puVar35 != uVar15)) {
              if ((uint)uVar28 < uVar19) {
                uVar15 = (uint)*puVar44 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar6 + uVar28);
              }
              if ((uint)*puVar44 == uVar15) {
                pUVar5[uVar26] = iVar43 - iVar32;
                iVar43 = 9;
              }
              else {
                uVar15 = pUVar5[uVar26];
                uVar28 = (ulong)uVar15;
                uVar29 = *puVar35 * -0x30e44323405a9d00 >> (bVar14 & 0x3f);
                uVar22 = iVar43 - iVar32;
                pUVar5[uVar26] = uVar22;
                if (uVar15 < uVar19) {
                  uVar15 = (uint)*puVar17 ^ 1;
                }
                else {
                  uVar15 = *(uint *)(pBVar6 + uVar28);
                }
                if ((uint)*puVar17 == uVar15) {
                  iVar43 = 9;
                  puVar25 = puVar10;
                  uVar24 = uVar26;
                  puVar18 = puVar35;
                  uVar26 = uVar29;
                  puVar44 = puVar17;
                  if (local_e8 < 5) {
                    pUVar5[uVar29] = (int)puVar35 - iVar32;
                  }
                }
                else {
                  uVar28 = (ulong)pUVar5[uVar29];
                  uVar26 = *puVar10 * -0x30e44323405a9d00 >> (bVar14 & 0x3f);
                  puVar25 = (ulong *)((long)puVar35 + (long)local_e8);
                  puVar13 = (ulong *)((long)puVar10 + (long)local_e8);
                  iVar43 = 0;
                  uVar24 = uVar29;
                  puVar18 = puVar10;
                  puVar44 = puVar35;
                  if (local_80 <= puVar25) {
                    local_e8 = (ulong *)((long)local_e8 + 1);
                    local_80 = local_80 + 0x10;
                  }
                }
              }
            }
            else {
              uVar29 = (ulong)(*(char *)((long)puVar35 + -1) ==
                              *(char *)((long)puVar35 + lVar33 + -1));
              puVar44 = (ulong *)((long)puVar35 - uVar29);
              local_78 = (BYTE *)((long)puVar35 + (lVar33 - uVar29));
              pvVar41 = (void *)(uVar29 | 4);
              pUVar5[uVar26] = iVar43 - iVar32;
              iVar43 = 8;
              local_b8 = 1;
            }
            puVar10 = puVar13;
            if (iVar43 != 0) break;
            puVar35 = puVar25;
            puVar17 = puVar18;
            local_98 = uVar40;
            if (puVar37 <= puVar10) goto LAB_01db6d72;
          }
          local_e8 = (ulong *)uVar20;
          if (iVar43 != 8) {
            local_78 = pBVar6 + uVar28;
            uVar15 = (int)puVar44 - (int)local_78;
            local_e8 = (ulong *)(ulong)uVar15;
            local_b8 = uVar15 + 3;
            pvVar41 = (void *)0x4;
            uVar40 = uVar20;
            if ((uVar19 < (uint)uVar28) && (local_d8 < puVar44)) {
              pBVar38 = pBVar6 + (uVar28 - 1);
              puVar35 = puVar44;
              while (local_78 = pBVar38, puVar44 = (ulong *)((long)puVar35 + -1),
                    *(BYTE *)puVar44 == *local_78) {
                pvVar41 = (void *)((long)pvVar41 + 1);
                if ((puVar44 <= local_d8) ||
                   (pBVar38 = local_78 + -1, puVar35 = puVar44, local_78 <= pBVar34))
                goto LAB_01db404b;
              }
              local_78 = local_78 + 1;
              puVar44 = puVar35;
            }
          }
LAB_01db404b:
          puVar35 = (ulong *)((long)puVar44 + (long)pvVar41);
          puVar17 = (ulong *)(local_78 + (long)pvVar41);
          puVar10 = puVar35;
          if (puVar35 < puVar1) {
            uVar24 = *puVar35 ^ *puVar17;
            uVar20 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar20 = uVar20 >> 3 & 0x1fffffff;
            if (*puVar17 == *puVar35) {
              do {
                puVar10 = puVar10 + 1;
                puVar17 = puVar17 + 1;
                if (puVar1 <= puVar10) goto LAB_01db40c4;
                uVar24 = *puVar10 ^ *puVar17;
                uVar20 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                uVar20 = (long)puVar10 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar35);
              } while (*puVar17 == *puVar10);
            }
          }
          else {
LAB_01db40c4:
            if ((puVar10 < (ulong *)((long)puVar2 - 3U)) && ((uint)*puVar17 == (uint)*puVar10)) {
              puVar10 = (ulong *)((long)puVar10 + 4);
              puVar17 = (ulong *)((long)puVar17 + 4);
            }
            if ((puVar10 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar17 == (short)*puVar10)) {
              puVar10 = (ulong *)((long)puVar10 + 2);
              puVar17 = (ulong *)((long)puVar17 + 2);
            }
            if (puVar10 < puVar2) {
              puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar17 == (char)*puVar10));
            }
            uVar20 = (long)puVar10 - (long)puVar35;
          }
          uVar24 = (long)puVar44 - (long)local_d8;
          puVar35 = (ulong *)seqStore->lit;
          if (puVar16 < puVar44) {
            ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)local_d8,(BYTE *)puVar44,(BYTE *)puVar16);
          }
          else {
            uVar26 = local_d8[1];
            *puVar35 = *local_d8;
            puVar35[1] = uVar26;
            if (0x10 < uVar24) {
              pBVar38 = seqStore->lit;
              uVar26 = local_d8[3];
              *(ulong *)(pBVar38 + 0x10) = local_d8[2];
              *(ulong *)(pBVar38 + 0x18) = uVar26;
              if (0x20 < (long)uVar24) {
                lVar33 = 0;
                do {
                  puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x20);
                  uVar8 = puVar4[1];
                  pBVar12 = pBVar38 + lVar33 + 0x20;
                  *(undefined8 *)pBVar12 = *puVar4;
                  *(undefined8 *)(pBVar12 + 8) = uVar8;
                  puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x30);
                  uVar8 = puVar4[1];
                  *(undefined8 *)(pBVar12 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar12 + 0x18) = uVar8;
                  lVar33 = lVar33 + 0x20;
                } while (pBVar12 + 0x20 < pBVar38 + uVar24);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar24;
          if (0xffff < uVar24) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          pvVar41 = (void *)(uVar20 + (long)pvVar41);
          psVar7 = seqStore->sequences;
          psVar7->litLength = (U16)uVar24;
          psVar7->offBase = local_b8;
          if (0xffff < (long)pvVar41 - 3U) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar7->mlBase = (U16)((long)pvVar41 - 3U);
          seqStore->sequences = psVar7 + 1;
          puVar44 = (ulong *)((long)puVar44 + (long)pvVar41);
          if (puVar44 <= puVar37) {
            pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar22 + 2) * -0x30e44323405a9d00) >>
                   (bVar14 & 0x3f)] = uVar22 + 2;
            pUVar5[(ulong)(*(long *)((long)puVar44 + -2) * -0x30e44323405a9d00) >> (bVar14 & 0x3f)]
                 = ((int)puVar44 + -2) - iVar32;
            if ((int)uVar40 == 0) {
              uVar40 = 0;
            }
            else {
              do {
                uVar24 = (ulong)local_e8;
                uVar20 = uVar40;
                local_e8 = (ulong *)uVar24;
                uVar40 = uVar20;
                if ((uint)*puVar44 != *(uint *)((long)puVar44 - uVar20)) break;
                puVar35 = (ulong *)((long)puVar44 + 4);
                puVar17 = (ulong *)((long)puVar44 + (4 - uVar20));
                puVar10 = puVar35;
                if (puVar35 < puVar1) {
                  uVar26 = *puVar35 ^ *puVar17;
                  uVar40 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar40 = uVar40 >> 3 & 0x1fffffff;
                  if (*puVar17 == *puVar35) {
                    puVar10 = (ulong *)((long)puVar44 + 0xc);
                    puVar17 = (ulong *)((long)puVar44 + (0xc - uVar20));
                    do {
                      if (puVar1 <= puVar10) goto LAB_01db42e7;
                      uVar26 = *puVar17;
                      uVar28 = *puVar10;
                      uVar29 = uVar28 ^ uVar26;
                      uVar40 = 0;
                      if (uVar29 != 0) {
                        for (; (uVar29 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar40 = (long)puVar10 + ((uVar40 >> 3 & 0x1fffffff) - (long)puVar35);
                      puVar10 = puVar10 + 1;
                      puVar17 = puVar17 + 1;
                    } while (uVar26 == uVar28);
                  }
                }
                else {
LAB_01db42e7:
                  if ((puVar10 < (ulong *)((long)puVar2 - 3U)) && ((uint)*puVar17 == (uint)*puVar10)
                     ) {
                    puVar10 = (ulong *)((long)puVar10 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar10 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar17 == (short)*puVar10)) {
                    puVar10 = (ulong *)((long)puVar10 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar10 < puVar2) {
                    puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar17 == (char)*puVar10));
                  }
                  uVar40 = (long)puVar10 - (long)puVar35;
                }
                pUVar5[*puVar44 * -0x30e44323405a9d00 >> (bVar14 & 0x3f)] = (int)puVar44 - iVar32;
                puVar35 = (ulong *)seqStore->lit;
                if (puVar16 < puVar44) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar35,(BYTE *)puVar44,(BYTE *)puVar44,(BYTE *)puVar16);
                }
                else {
                  uVar26 = puVar44[1];
                  *puVar35 = *puVar44;
                  puVar35[1] = uVar26;
                }
                psVar7 = seqStore->sequences;
                psVar7->litLength = 0;
                psVar7->offBase = 1;
                if (0xffff < uVar40 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar44 = (ulong *)((long)puVar44 + uVar40 + 4);
                psVar7->mlBase = (U16)(uVar40 + 1);
                seqStore->sequences = psVar7 + 1;
                local_e8 = (ulong *)uVar20;
                uVar40 = uVar24;
              } while (puVar44 <= puVar37);
            }
          }
          uVar36 = (uint)local_e8;
          local_98._0_4_ = (uint)uVar40;
          puVar35 = (ulong *)((long)puVar44 + uVar27);
          puVar10 = (ulong *)((long)puVar44 + uVar27 + 1);
          uVar20 = (ulong)local_e8;
          local_d8 = puVar44;
        } while (puVar10 < puVar37);
      }
    }
    else if (puVar10 < puVar37) {
      bVar14 = 0x20 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar16 = puVar2 + -4;
      pvVar41 = src;
      local_d8 = (ulong *)src;
      do {
        uVar24 = (ulong)((uint)*puVar44 * -0x61c8864f >> (bVar14 & 0x1f));
        local_c8 = puVar44 + 0x10;
        uVar28 = (ulong)pUVar5[uVar24];
        uVar36 = (uint)uVar20;
        lVar33 = -uVar20;
        uVar26 = (ulong)((uint)(*(int *)((long)puVar44 + 1) * -0x61c8864f) >> (bVar14 & 0x1f));
        puVar17 = (ulong *)((long)puVar44 + 1);
        local_e8 = (ulong *)uVar27;
        while( true ) {
          uVar22 = (int)puVar44 - iVar32;
          uVar15 = *(uint *)((long)puVar35 + lVar33);
          pUVar5[uVar24] = uVar22;
          iVar43 = (int)puVar17;
          puVar18 = puVar17;
          puVar25 = puVar35;
          puVar13 = puVar10;
          if ((uVar36 == 0) || ((uint)*puVar35 != uVar15)) {
            if ((uint)uVar28 < uVar19) {
              uVar15 = (uint)*puVar44 ^ 1;
            }
            else {
              uVar15 = *(uint *)(pBVar6 + uVar28);
            }
            if ((uint)*puVar44 == uVar15) {
              pUVar5[uVar26] = iVar43 - iVar32;
              iVar43 = 9;
            }
            else {
              uVar15 = pUVar5[uVar26];
              uVar28 = (ulong)uVar15;
              uVar29 = (ulong)((uint)*puVar35 * -0x61c8864f >> (bVar14 & 0x1f));
              uVar22 = iVar43 - iVar32;
              pUVar5[uVar26] = uVar22;
              if (uVar15 < uVar19) {
                uVar15 = (uint)*puVar17 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar6 + uVar28);
              }
              if ((uint)*puVar17 == uVar15) {
                iVar43 = 9;
                puVar18 = puVar35;
                puVar25 = puVar10;
                uVar24 = uVar26;
                uVar26 = uVar29;
                puVar44 = puVar17;
                if (local_e8 < 5) {
                  pUVar5[uVar29] = (int)puVar35 - iVar32;
                }
              }
              else {
                uVar28 = (ulong)pUVar5[uVar29];
                uVar26 = (ulong)((uint)*puVar10 * -0x61c8864f >> (bVar14 & 0x1f));
                puVar25 = (ulong *)((long)puVar35 + (long)local_e8);
                puVar13 = (ulong *)((long)puVar10 + (long)local_e8);
                iVar43 = 0;
                puVar18 = puVar10;
                uVar24 = uVar29;
                puVar44 = puVar35;
                if (local_c8 <= puVar25) {
                  local_e8 = (ulong *)((long)local_e8 + 1);
                  local_c8 = local_c8 + 0x10;
                }
              }
            }
          }
          else {
            uVar29 = (ulong)(*(char *)((long)puVar35 + -1) == *(char *)((long)puVar35 + lVar33 + -1)
                            );
            puVar44 = (ulong *)((long)puVar35 - uVar29);
            local_78 = (BYTE *)((long)puVar35 + (lVar33 - uVar29));
            pvVar41 = (void *)(uVar29 | 4);
            pUVar5[uVar26] = iVar43 - iVar32;
            iVar43 = 8;
            local_b8 = 1;
          }
          puVar10 = puVar13;
          if (iVar43 != 0) break;
          puVar35 = puVar25;
          puVar17 = puVar18;
          local_98 = uVar40;
          if (puVar37 <= puVar10) goto LAB_01db6d72;
        }
        local_c8 = (ulong *)uVar20;
        if (iVar43 != 8) {
          local_78 = pBVar6 + uVar28;
          uVar15 = (int)puVar44 - (int)local_78;
          local_c8 = (ulong *)(ulong)uVar15;
          local_b8 = uVar15 + 3;
          pvVar41 = (void *)0x4;
          uVar40 = uVar20;
          if ((uVar19 < (uint)uVar28) && (local_d8 < puVar44)) {
            pBVar38 = pBVar6 + (uVar28 - 1);
            puVar35 = puVar44;
            while (local_78 = pBVar38, puVar44 = (ulong *)((long)puVar35 + -1),
                  *(BYTE *)puVar44 == *local_78) {
              pvVar41 = (void *)((long)pvVar41 + 1);
              if ((puVar44 <= local_d8) ||
                 (pBVar38 = local_78 + -1, puVar35 = puVar44, local_78 <= pBVar34))
              goto LAB_01db69bb;
            }
            local_78 = local_78 + 1;
            puVar44 = puVar35;
          }
        }
LAB_01db69bb:
        puVar35 = (ulong *)((long)puVar44 + (long)pvVar41);
        puVar17 = (ulong *)(local_78 + (long)pvVar41);
        puVar10 = puVar35;
        if (puVar35 < puVar1) {
          uVar24 = *puVar35 ^ *puVar17;
          uVar20 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          uVar20 = uVar20 >> 3 & 0x1fffffff;
          if (*puVar17 == *puVar35) {
            do {
              puVar10 = puVar10 + 1;
              puVar17 = puVar17 + 1;
              if (puVar1 <= puVar10) goto LAB_01db6a34;
              uVar24 = *puVar10 ^ *puVar17;
              uVar20 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar20 = (long)puVar10 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar35);
            } while (*puVar17 == *puVar10);
          }
        }
        else {
LAB_01db6a34:
          if ((puVar10 < (ulong *)((long)puVar2 - 3U)) && ((uint)*puVar17 == (uint)*puVar10)) {
            puVar10 = (ulong *)((long)puVar10 + 4);
            puVar17 = (ulong *)((long)puVar17 + 4);
          }
          if ((puVar10 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar17 == (short)*puVar10)) {
            puVar10 = (ulong *)((long)puVar10 + 2);
            puVar17 = (ulong *)((long)puVar17 + 2);
          }
          if (puVar10 < puVar2) {
            puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar17 == (char)*puVar10));
          }
          uVar20 = (long)puVar10 - (long)puVar35;
        }
        uVar24 = (long)puVar44 - (long)local_d8;
        puVar35 = (ulong *)seqStore->lit;
        if (puVar16 < puVar44) {
          ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)local_d8,(BYTE *)puVar44,(BYTE *)puVar16);
        }
        else {
          uVar26 = local_d8[1];
          *puVar35 = *local_d8;
          puVar35[1] = uVar26;
          if (0x10 < uVar24) {
            pBVar38 = seqStore->lit;
            uVar26 = local_d8[3];
            *(ulong *)(pBVar38 + 0x10) = local_d8[2];
            *(ulong *)(pBVar38 + 0x18) = uVar26;
            if (0x20 < (long)uVar24) {
              lVar33 = 0;
              do {
                puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x20);
                uVar8 = puVar4[1];
                pBVar12 = pBVar38 + lVar33 + 0x20;
                *(undefined8 *)pBVar12 = *puVar4;
                *(undefined8 *)(pBVar12 + 8) = uVar8;
                puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x30);
                uVar8 = puVar4[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar12 + 0x18) = uVar8;
                lVar33 = lVar33 + 0x20;
              } while (pBVar12 + 0x20 < pBVar38 + uVar24);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        pvVar41 = (void *)(uVar20 + (long)pvVar41);
        psVar7 = seqStore->sequences;
        psVar7->litLength = (U16)uVar24;
        psVar7->offBase = local_b8;
        if (0xffff < (long)pvVar41 - 3U) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar7->mlBase = (U16)((long)pvVar41 - 3U);
        seqStore->sequences = psVar7 + 1;
        puVar44 = (ulong *)((long)puVar44 + (long)pvVar41);
        if (puVar44 <= puVar37) {
          pUVar5[(uint)(*(int *)(pBVar6 + (ulong)uVar22 + 2) * -0x61c8864f) >> (bVar14 & 0x1f)] =
               uVar22 + 2;
          pUVar5[(uint)(*(int *)((long)puVar44 + -2) * -0x61c8864f) >> (bVar14 & 0x1f)] =
               ((int)puVar44 + -2) - iVar32;
          if ((int)uVar40 == 0) {
            uVar40 = 0;
          }
          else {
            do {
              uVar24 = (ulong)local_c8;
              uVar20 = uVar40;
              local_c8 = (ulong *)uVar24;
              uVar40 = uVar20;
              if ((uint)*puVar44 != *(uint *)((long)puVar44 - uVar20)) break;
              puVar35 = (ulong *)((long)puVar44 + 4);
              puVar17 = (ulong *)((long)puVar44 + (4 - uVar20));
              puVar10 = puVar35;
              if (puVar35 < puVar1) {
                uVar26 = *puVar35 ^ *puVar17;
                uVar40 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                  }
                }
                uVar40 = uVar40 >> 3 & 0x1fffffff;
                if (*puVar17 == *puVar35) {
                  puVar10 = (ulong *)((long)puVar44 + 0xc);
                  puVar17 = (ulong *)((long)puVar44 + (0xc - uVar20));
                  do {
                    if (puVar1 <= puVar10) goto LAB_01db6c4c;
                    uVar26 = *puVar17;
                    uVar28 = *puVar10;
                    uVar29 = uVar28 ^ uVar26;
                    uVar40 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    uVar40 = (long)puVar10 + ((uVar40 >> 3 & 0x1fffffff) - (long)puVar35);
                    puVar10 = puVar10 + 1;
                    puVar17 = puVar17 + 1;
                  } while (uVar26 == uVar28);
                }
              }
              else {
LAB_01db6c4c:
                if ((puVar10 < (ulong *)((long)puVar2 - 3U)) && ((uint)*puVar17 == (uint)*puVar10))
                {
                  puVar10 = (ulong *)((long)puVar10 + 4);
                  puVar17 = (ulong *)((long)puVar17 + 4);
                }
                if ((puVar10 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar17 == (short)*puVar10)
                   ) {
                  puVar10 = (ulong *)((long)puVar10 + 2);
                  puVar17 = (ulong *)((long)puVar17 + 2);
                }
                if (puVar10 < puVar2) {
                  puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar17 == (char)*puVar10));
                }
                uVar40 = (long)puVar10 - (long)puVar35;
              }
              pUVar5[(uint)*puVar44 * -0x61c8864f >> (bVar14 & 0x1f)] = (int)puVar44 - iVar32;
              puVar35 = (ulong *)seqStore->lit;
              if (puVar16 < puVar44) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar35,(BYTE *)puVar44,(BYTE *)puVar44,(BYTE *)puVar16);
              }
              else {
                uVar26 = puVar44[1];
                *puVar35 = *puVar44;
                puVar35[1] = uVar26;
              }
              psVar7 = seqStore->sequences;
              psVar7->litLength = 0;
              psVar7->offBase = 1;
              if (0xffff < uVar40 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
              }
              puVar44 = (ulong *)((long)puVar44 + uVar40 + 4);
              psVar7->mlBase = (U16)(uVar40 + 1);
              seqStore->sequences = psVar7 + 1;
              local_c8 = (ulong *)uVar20;
              uVar40 = uVar24;
            } while (puVar44 <= puVar37);
          }
        }
        uVar36 = (uint)local_c8;
        local_98._0_4_ = (uint)uVar40;
        puVar35 = (ulong *)((long)puVar44 + uVar27);
        puVar10 = (ulong *)((long)puVar44 + uVar27 + 1);
        uVar20 = (ulong)local_c8;
        local_d8 = puVar44;
      } while (puVar10 < puVar37);
    }
    goto LAB_01db6d7e;
  }
  pBVar6 = (ms->window).base;
  puVar2 = (ulong *)((long)src + srcSize);
  iVar43 = (int)pBVar6;
  iVar32 = (int)puVar2 - iVar43;
  uVar19 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar9 = (ms->window).dictLimit;
  uVar23 = iVar32 - uVar19;
  if (iVar32 - uVar9 <= uVar19) {
    uVar23 = uVar9;
  }
  if (ms->loadedDictEnd != 0) {
    uVar23 = uVar9;
  }
  pBVar34 = pBVar6 + uVar23;
  puVar44 = (ulong *)((long)src + (ulong)(pBVar34 == (BYTE *)src));
  iVar32 = (int)puVar44 - iVar43;
  uVar36 = iVar32 - uVar19;
  if (iVar32 - uVar9 <= uVar19) {
    uVar36 = uVar9;
  }
  if (ms->loadedDictEnd != 0) {
    uVar36 = uVar9;
  }
  uVar9 = *rep;
  uVar19 = rep[1];
  uVar36 = iVar32 - uVar36;
  local_70 = uVar19;
  if (uVar36 < uVar19) {
    local_70 = 0;
  }
  uVar21 = 0;
  if (uVar9 <= uVar36) {
    uVar21 = uVar9;
  }
  puVar37 = (ulong *)(ulong)uVar21;
  puVar10 = (ulong *)((long)src + (srcSize - 8));
  puVar35 = (ulong *)((long)src + (ulong)(pBVar34 == (BYTE *)src) + 3);
  if (uVar15 == 5) {
    if (puVar35 < puVar10) {
      bVar14 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 + -7);
      puVar16 = puVar2 + -4;
      puVar42 = (undefined1 *)src;
      do {
        puVar17 = (ulong *)((long)puVar44 + 1);
        uVar27 = *puVar44 * -0x30e4432345000000 >> (bVar14 & 0x3f);
        local_e8 = puVar44 + 0x10;
        uVar24 = (ulong)pUVar5[uVar27];
        uVar21 = (uint)puVar37;
        lVar33 = -(long)puVar37;
        uVar20 = 2;
        uVar40 = (ulong)(*(long *)((long)puVar44 + 1) * -0x30e4432345000000) >> (bVar14 & 0x3f);
        puVar25 = (ulong *)((long)puVar44 + 2);
        while( true ) {
          uVar22 = (int)puVar44 - iVar43;
          uVar15 = *(uint *)((long)puVar25 + lVar33);
          pUVar5[uVar27] = uVar22;
          iVar32 = (int)puVar17;
          puVar13 = puVar25;
          puVar18 = puVar35;
          if ((uVar21 == 0) || ((uint)*puVar25 != uVar15)) {
            if ((uint)uVar24 < uVar23) {
              uVar15 = (uint)*puVar44 ^ 1;
            }
            else {
              uVar15 = *(uint *)(pBVar6 + uVar24);
            }
            if ((uint)*puVar44 == uVar15) {
              pUVar5[uVar40] = iVar32 - iVar43;
              iVar32 = 9;
            }
            else {
              uVar15 = pUVar5[uVar40];
              uVar24 = (ulong)uVar15;
              uVar26 = *puVar25 * -0x30e4432345000000 >> (bVar14 & 0x3f);
              uVar22 = iVar32 - iVar43;
              pUVar5[uVar40] = uVar22;
              if (uVar15 < uVar23) {
                uVar15 = (uint)*puVar17 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar6 + uVar24);
              }
              if ((uint)*puVar17 == uVar15) {
                iVar32 = 9;
                puVar13 = puVar35;
                uVar27 = uVar40;
                uVar40 = uVar26;
                puVar44 = puVar17;
                puVar17 = puVar25;
                if (uVar20 < 5) {
                  pUVar5[uVar26] = (int)puVar25 - iVar43;
                }
              }
              else {
                uVar24 = (ulong)pUVar5[uVar26];
                uVar40 = *puVar35 * -0x30e4432345000000 >> (bVar14 & 0x3f);
                puVar13 = (ulong *)((long)puVar25 + uVar20);
                puVar18 = (ulong *)((long)puVar35 + uVar20);
                iVar32 = 0;
                uVar27 = uVar26;
                puVar44 = puVar25;
                puVar17 = puVar35;
                if (local_e8 <= puVar13) {
                  uVar20 = uVar20 + 1;
                  local_e8 = local_e8 + 0x10;
                }
              }
            }
          }
          else {
            uVar26 = (ulong)(*(char *)((long)puVar25 + -1) == *(char *)((long)puVar25 + lVar33 + -1)
                            );
            puVar44 = (ulong *)((long)puVar25 - uVar26);
            local_78 = (BYTE *)((long)puVar25 + (lVar33 - uVar26));
            puVar42 = (undefined1 *)(uVar26 | 4);
            pUVar5[uVar40] = iVar32 - iVar43;
            iVar32 = 8;
            local_98._0_4_ = 1;
          }
          puVar35 = puVar18;
          if (iVar32 != 0) break;
          puVar25 = puVar13;
          if (puVar10 <= puVar35) goto LAB_01db7481;
        }
        if (iVar32 == 8) {
          local_c0 = (BYTE *)(ulong)local_70;
          local_e8 = puVar37;
        }
        else {
          local_78 = pBVar6 + uVar24;
          uVar15 = (int)puVar44 - (int)local_78;
          local_e8 = (ulong *)(ulong)uVar15;
          local_98._0_4_ = uVar15 + 3;
          puVar42 = (undefined1 *)0x4;
          local_c0 = (BYTE *)puVar37;
          if ((uVar23 < (uint)uVar24) && (local_d8 < puVar44)) {
            pBVar38 = pBVar6 + (uVar24 - 1);
            puVar35 = puVar44;
            while (local_78 = pBVar38, puVar44 = (ulong *)((long)puVar35 + -1),
                  *(BYTE *)puVar44 == *local_78) {
              puVar42 = puVar42 + 1;
              if ((puVar44 <= local_d8) ||
                 (pBVar38 = local_78 + -1, puVar35 = puVar44, local_78 <= pBVar34))
              goto LAB_01db6325;
            }
            local_78 = local_78 + 1;
            puVar44 = puVar35;
          }
        }
LAB_01db6325:
        puVar35 = (ulong *)((long)puVar44 + (long)puVar42);
        puVar37 = (ulong *)(local_78 + (long)puVar42);
        puVar17 = puVar35;
        if (puVar35 < puVar1) {
          uVar40 = *puVar35 ^ *puVar37;
          uVar27 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          puVar31 = (undefined1 *)(uVar27 >> 3 & 0x1fffffff);
          if (*puVar37 == *puVar35) {
            do {
              puVar17 = puVar17 + 1;
              puVar37 = puVar37 + 1;
              if (puVar1 <= puVar17) goto LAB_01db639b;
              uVar40 = *puVar17 ^ *puVar37;
              uVar27 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              puVar31 = (undefined1 *)((long)puVar17 + ((uVar27 >> 3 & 0x1fffffff) - (long)puVar35))
              ;
            } while (*puVar37 == *puVar17);
          }
        }
        else {
LAB_01db639b:
          if ((puVar17 < (ulong *)((long)puVar2 + -3)) && ((uint)*puVar37 == (uint)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 4);
            puVar37 = (ulong *)((long)puVar37 + 4);
          }
          if ((puVar17 < (ulong *)((long)puVar2 + -1)) && ((short)*puVar37 == (short)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 2);
            puVar37 = (ulong *)((long)puVar37 + 2);
          }
          if (puVar17 < puVar2) {
            puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar37 == (char)*puVar17));
          }
          puVar31 = (undefined1 *)((long)puVar17 - (long)puVar35);
        }
        uVar27 = (long)puVar44 - (long)local_d8;
        puVar35 = (ulong *)seqStore->lit;
        if (puVar16 < puVar44) {
          ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)local_d8,(BYTE *)puVar44,(BYTE *)puVar16);
        }
        else {
          uVar40 = local_d8[1];
          *puVar35 = *local_d8;
          puVar35[1] = uVar40;
          if (0x10 < uVar27) {
            pBVar38 = seqStore->lit;
            uVar40 = local_d8[3];
            *(ulong *)(pBVar38 + 0x10) = local_d8[2];
            *(ulong *)(pBVar38 + 0x18) = uVar40;
            if (0x20 < (long)uVar27) {
              lVar33 = 0;
              do {
                puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x20);
                uVar8 = puVar4[1];
                pBVar12 = pBVar38 + lVar33 + 0x20;
                *(undefined8 *)pBVar12 = *puVar4;
                *(undefined8 *)(pBVar12 + 8) = uVar8;
                puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x30);
                uVar8 = puVar4[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar12 + 0x18) = uVar8;
                lVar33 = lVar33 + 0x20;
              } while (pBVar12 + 0x20 < pBVar38 + uVar27);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar27;
        if (0xffff < uVar27) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        puVar42 = puVar31 + (long)puVar42;
        psVar7 = seqStore->sequences;
        psVar7->litLength = (U16)uVar27;
        psVar7->offBase = (uint)local_98;
        if ((undefined1 *)0xffff < puVar42 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar7->mlBase = (U16)(puVar42 + -3);
        seqStore->sequences = psVar7 + 1;
        local_d8 = (ulong *)((long)puVar44 + (long)puVar42);
        puVar37 = local_e8;
        if (local_d8 <= puVar10) {
          pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar22 + 2) * -0x30e4432345000000) >>
                 (bVar14 & 0x3f)] = uVar22 + 2;
          pUVar5[(ulong)(*(long *)((long)local_d8 + -2) * -0x30e4432345000000) >> (bVar14 & 0x3f)] =
               ((int)local_d8 + -2) - iVar43;
          if ((uint)local_c0 == 0) {
            local_c0._0_4_ = 0;
          }
          else {
            do {
              pBVar38 = (BYTE *)(ulong)(uint)local_c0;
              uVar15 = (uint)local_e8;
              puVar37 = local_e8;
              if ((uint)*local_d8 != *(uint *)((long)local_d8 - (long)pBVar38)) break;
              puVar44 = (ulong *)((long)local_d8 + 4);
              puVar37 = (ulong *)((long)local_d8 + (4 - (long)pBVar38));
              puVar35 = puVar44;
              if (puVar44 < puVar1) {
                uVar40 = *puVar44 ^ *puVar37;
                uVar27 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                puVar31 = (undefined1 *)(uVar27 >> 3 & 0x1fffffff);
                if (*puVar37 == *puVar44) {
                  puVar35 = (ulong *)((long)local_d8 + 0xc);
                  puVar37 = (ulong *)((long)local_d8 + (0xc - (long)pBVar38));
                  do {
                    if (puVar1 <= puVar35) goto LAB_01db65b6;
                    uVar27 = *puVar37;
                    uVar40 = *puVar35;
                    uVar24 = uVar40 ^ uVar27;
                    uVar20 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    puVar31 = (undefined1 *)
                              ((long)puVar35 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar44));
                    puVar35 = puVar35 + 1;
                    puVar37 = puVar37 + 1;
                  } while (uVar27 == uVar40);
                }
              }
              else {
LAB_01db65b6:
                if ((puVar35 < (ulong *)((long)puVar2 + -3)) && ((uint)*puVar37 == (uint)*puVar35))
                {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar35 < (ulong *)((long)puVar2 + -1)) && ((short)*puVar37 == (short)*puVar35)
                   ) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar35 < puVar2) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar37 == (char)*puVar35));
                }
                puVar31 = (undefined1 *)((long)puVar35 - (long)puVar44);
              }
              pUVar5[*local_d8 * -0x30e4432345000000 >> (bVar14 & 0x3f)] = (int)local_d8 - iVar43;
              puVar44 = (ulong *)seqStore->lit;
              if (puVar16 < local_d8) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar44,(BYTE *)local_d8,(BYTE *)local_d8,(BYTE *)puVar16);
              }
              else {
                uVar27 = local_d8[1];
                *puVar44 = *local_d8;
                puVar44[1] = uVar27;
              }
              psVar7 = seqStore->sequences;
              psVar7->litLength = 0;
              psVar7->offBase = 1;
              if ((undefined1 *)0xffff < puVar31 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
              }
              local_d8 = (ulong *)((long)local_d8 + (long)(puVar31 + 4));
              psVar7->mlBase = (U16)(puVar31 + 1);
              seqStore->sequences = psVar7 + 1;
              local_e8 = (ulong *)pBVar38;
              puVar37 = (ulong *)pBVar38;
              local_c0._0_4_ = uVar15;
            } while (local_d8 <= puVar10);
          }
        }
        puVar35 = (ulong *)((long)local_d8 + 3);
        uVar21 = (uint)puVar37;
        puVar44 = local_d8;
        local_70 = (uint)local_c0;
      } while (puVar35 < puVar10);
    }
LAB_01db7481:
    if (uVar19 <= uVar36) {
      uVar19 = 0;
    }
    uVar15 = uVar19;
    if (uVar21 != 0) {
      uVar15 = uVar9;
    }
    if (uVar9 <= uVar36) {
      uVar15 = uVar19;
      uVar9 = 0;
    }
    if (uVar21 != 0) {
      uVar9 = uVar21;
    }
    *rep = uVar9;
    if (local_70 != 0) {
      uVar15 = local_70;
    }
    rep[1] = uVar15;
    goto LAB_01db752f;
  }
  if (uVar15 == 6) {
    if (puVar35 < puVar10) {
      bVar14 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 + -7);
      puVar16 = puVar2 + -4;
      pBVar38 = (BYTE *)puVar37;
      do {
        uVar27 = *puVar44 * -0x30e4432340650000 >> (bVar14 & 0x3f);
        local_a0 = puVar44 + 0x10;
        uVar24 = (ulong)pUVar5[uVar27];
        uVar21 = (uint)puVar37;
        lVar33 = -(long)puVar37;
        uVar20 = 2;
        uVar40 = (ulong)(*(long *)((long)puVar44 + 1) * -0x30e4432340650000) >> (bVar14 & 0x3f);
        puVar17 = (ulong *)((long)puVar44 + 2);
        puVar25 = (ulong *)((long)puVar44 + 1);
        while( true ) {
          uVar22 = (int)puVar44 - iVar43;
          uVar15 = *(uint *)((long)puVar17 + lVar33);
          pUVar5[uVar27] = uVar22;
          iVar32 = (int)puVar25;
          puVar13 = puVar17;
          puVar39 = puVar25;
          puVar18 = puVar35;
          if ((uVar21 == 0) || ((uint)*puVar17 != uVar15)) {
            if ((uint)uVar24 < uVar23) {
              uVar15 = (uint)*puVar44 ^ 1;
            }
            else {
              uVar15 = *(uint *)(pBVar6 + uVar24);
            }
            if ((uint)*puVar44 == uVar15) {
              pUVar5[uVar40] = iVar32 - iVar43;
              iVar32 = 9;
            }
            else {
              uVar15 = pUVar5[uVar40];
              uVar24 = (ulong)uVar15;
              uVar26 = *puVar17 * -0x30e4432340650000 >> (bVar14 & 0x3f);
              uVar22 = iVar32 - iVar43;
              pUVar5[uVar40] = uVar22;
              if (uVar15 < uVar23) {
                uVar15 = (uint)*puVar25 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar6 + uVar24);
              }
              if ((uint)*puVar25 == uVar15) {
                iVar32 = 9;
                puVar13 = puVar35;
                uVar27 = uVar40;
                uVar40 = uVar26;
                puVar39 = puVar17;
                puVar44 = puVar25;
                if (uVar20 < 5) {
                  pUVar5[uVar26] = (int)puVar17 - iVar43;
                }
              }
              else {
                uVar24 = (ulong)pUVar5[uVar26];
                uVar40 = *puVar35 * -0x30e4432340650000 >> (bVar14 & 0x3f);
                puVar13 = (ulong *)((long)puVar17 + uVar20);
                puVar18 = (ulong *)((long)puVar35 + uVar20);
                iVar32 = 0;
                uVar27 = uVar26;
                puVar39 = puVar35;
                puVar44 = puVar17;
                if (local_a0 <= puVar13) {
                  uVar20 = uVar20 + 1;
                  local_a0 = local_a0 + 0x10;
                }
              }
            }
          }
          else {
            uVar26 = (ulong)(*(char *)((long)puVar17 + -1) == *(char *)((long)puVar17 + lVar33 + -1)
                            );
            puVar44 = (ulong *)((long)puVar17 - uVar26);
            local_c8 = (ulong *)((long)puVar17 + (lVar33 - uVar26));
            pBVar38 = (BYTE *)(uVar26 | 4);
            pUVar5[uVar40] = iVar32 - iVar43;
            iVar32 = 8;
            local_78 = &DAT_00000001;
          }
          puVar35 = puVar18;
          if (iVar32 != 0) break;
          puVar17 = puVar13;
          puVar25 = puVar39;
          if (puVar10 <= puVar35) goto LAB_01db7481;
        }
        if (iVar32 == 8) {
          local_c0 = (BYTE *)(ulong)local_70;
          local_a0 = puVar37;
        }
        else {
          local_c8 = (ulong *)(pBVar6 + uVar24);
          uVar15 = (int)puVar44 - (int)local_c8;
          local_a0 = (ulong *)(ulong)uVar15;
          local_78 = (BYTE *)(ulong)(uVar15 + 3);
          pBVar38 = (BYTE *)0x4;
          local_c0 = (BYTE *)puVar37;
          if ((uVar23 < (uint)uVar24) && (local_d8 < puVar44)) {
            pBVar12 = pBVar6 + (uVar24 - 1);
            puVar35 = puVar44;
            while (local_c8 = (ulong *)pBVar12, puVar44 = (ulong *)((long)puVar35 + -1),
                  *(BYTE *)puVar44 == *(BYTE *)local_c8) {
              pBVar38 = pBVar38 + 1;
              if ((puVar44 <= local_d8) ||
                 (pBVar12 = (BYTE *)((long)local_c8 + -1), puVar35 = puVar44, local_c8 <= pBVar34))
              goto LAB_01db558a;
            }
            local_c8 = (ulong *)((long)local_c8 + 1);
            puVar44 = puVar35;
          }
        }
LAB_01db558a:
        puVar35 = (ulong *)((long)puVar44 + (long)pBVar38);
        puVar37 = (ulong *)((long)local_c8 + (long)pBVar38);
        puVar17 = puVar35;
        if (puVar35 < puVar1) {
          uVar40 = *puVar35 ^ *puVar37;
          uVar27 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          puVar42 = (undefined1 *)(uVar27 >> 3 & 0x1fffffff);
          if (*puVar37 == *puVar35) {
            do {
              puVar17 = puVar17 + 1;
              puVar37 = puVar37 + 1;
              if (puVar1 <= puVar17) goto LAB_01db55fd;
              uVar40 = *puVar17 ^ *puVar37;
              uVar27 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              puVar42 = (undefined1 *)((long)puVar17 + ((uVar27 >> 3 & 0x1fffffff) - (long)puVar35))
              ;
            } while (*puVar37 == *puVar17);
          }
        }
        else {
LAB_01db55fd:
          if ((puVar17 < (ulong *)((long)puVar2 + -3)) && ((uint)*puVar37 == (uint)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 4);
            puVar37 = (ulong *)((long)puVar37 + 4);
          }
          if ((puVar17 < (ulong *)((long)puVar2 + -1)) && ((short)*puVar37 == (short)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 2);
            puVar37 = (ulong *)((long)puVar37 + 2);
          }
          if (puVar17 < puVar2) {
            puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar37 == (char)*puVar17));
          }
          puVar42 = (undefined1 *)((long)puVar17 - (long)puVar35);
        }
        uVar27 = (long)puVar44 - (long)local_d8;
        puVar35 = (ulong *)seqStore->lit;
        if (puVar16 < puVar44) {
          ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)local_d8,(BYTE *)puVar44,(BYTE *)puVar16);
        }
        else {
          uVar40 = local_d8[1];
          *puVar35 = *local_d8;
          puVar35[1] = uVar40;
          if (0x10 < uVar27) {
            pBVar12 = seqStore->lit;
            uVar40 = local_d8[3];
            *(ulong *)(pBVar12 + 0x10) = local_d8[2];
            *(ulong *)(pBVar12 + 0x18) = uVar40;
            if (0x20 < (long)uVar27) {
              lVar33 = 0;
              do {
                puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x20);
                uVar8 = puVar4[1];
                pBVar11 = pBVar12 + lVar33 + 0x20;
                *(undefined8 *)pBVar11 = *puVar4;
                *(undefined8 *)(pBVar11 + 8) = uVar8;
                puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x30);
                uVar8 = puVar4[1];
                *(undefined8 *)(pBVar11 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar11 + 0x18) = uVar8;
                lVar33 = lVar33 + 0x20;
              } while (pBVar11 + 0x20 < pBVar12 + uVar27);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar27;
        if (0xffff < uVar27) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        pBVar38 = pBVar38 + (long)puVar42;
        psVar7 = seqStore->sequences;
        psVar7->litLength = (U16)uVar27;
        psVar7->offBase = (U32)local_78;
        if ((BYTE *)0xffff < pBVar38 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar7->mlBase = (U16)(pBVar38 + -3);
        seqStore->sequences = psVar7 + 1;
        local_d8 = (ulong *)((long)puVar44 + (long)pBVar38);
        puVar37 = local_a0;
        if (local_d8 <= puVar10) {
          pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar22 + 2) * -0x30e4432340650000) >>
                 (bVar14 & 0x3f)] = uVar22 + 2;
          pUVar5[(ulong)(*(long *)((long)local_d8 + -2) * -0x30e4432340650000) >> (bVar14 & 0x3f)] =
               ((int)local_d8 + -2) - iVar43;
          if ((uint)local_c0 == 0) {
            local_c0._0_4_ = 0;
          }
          else {
            do {
              pBVar12 = (BYTE *)(ulong)(uint)local_c0;
              uVar15 = (uint)local_a0;
              puVar37 = local_a0;
              if ((uint)*local_d8 != *(uint *)((long)local_d8 - (long)pBVar12)) break;
              puVar44 = (ulong *)((long)local_d8 + 4);
              puVar37 = (ulong *)((long)local_d8 + (4 - (long)pBVar12));
              puVar35 = puVar44;
              if (puVar44 < puVar1) {
                uVar40 = *puVar44 ^ *puVar37;
                uVar27 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                puVar42 = (undefined1 *)(uVar27 >> 3 & 0x1fffffff);
                if (*puVar37 == *puVar44) {
                  puVar35 = (ulong *)((long)local_d8 + 0xc);
                  puVar37 = (ulong *)((long)local_d8 + (0xc - (long)pBVar12));
                  do {
                    if (puVar1 <= puVar35) goto LAB_01db581a;
                    uVar27 = *puVar37;
                    uVar40 = *puVar35;
                    uVar24 = uVar40 ^ uVar27;
                    uVar20 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    puVar42 = (undefined1 *)
                              ((long)puVar35 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar44));
                    puVar35 = puVar35 + 1;
                    puVar37 = puVar37 + 1;
                  } while (uVar27 == uVar40);
                }
              }
              else {
LAB_01db581a:
                if ((puVar35 < (ulong *)((long)puVar2 + -3)) && ((uint)*puVar37 == (uint)*puVar35))
                {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar35 < (ulong *)((long)puVar2 + -1)) && ((short)*puVar37 == (short)*puVar35)
                   ) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar35 < puVar2) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar37 == (char)*puVar35));
                }
                puVar42 = (undefined1 *)((long)puVar35 - (long)puVar44);
              }
              pUVar5[*local_d8 * -0x30e4432340650000 >> (bVar14 & 0x3f)] = (int)local_d8 - iVar43;
              puVar44 = (ulong *)seqStore->lit;
              if (puVar16 < local_d8) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar44,(BYTE *)local_d8,(BYTE *)local_d8,(BYTE *)puVar16);
              }
              else {
                uVar27 = local_d8[1];
                *puVar44 = *local_d8;
                puVar44[1] = uVar27;
              }
              psVar7 = seqStore->sequences;
              psVar7->litLength = 0;
              psVar7->offBase = 1;
              if ((undefined1 *)0xffff < puVar42 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
              }
              local_d8 = (ulong *)((long)local_d8 + (long)(puVar42 + 4));
              psVar7->mlBase = (U16)(puVar42 + 1);
              seqStore->sequences = psVar7 + 1;
              local_a0 = (ulong *)pBVar12;
              puVar37 = (ulong *)pBVar12;
              local_c0._0_4_ = uVar15;
            } while (local_d8 <= puVar10);
          }
        }
        puVar35 = (ulong *)((long)local_d8 + 3);
        uVar21 = (uint)puVar37;
        puVar44 = local_d8;
        local_70 = (uint)local_c0;
      } while (puVar35 < puVar10);
    }
    goto LAB_01db7481;
  }
  if (uVar15 == 7) {
    if (puVar35 < puVar10) {
      bVar14 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 + -7);
      puVar16 = puVar2 + -4;
      pBVar38 = (BYTE *)puVar37;
      puVar42 = (undefined1 *)src;
      do {
        puVar17 = (ulong *)((long)puVar44 + 1);
        uVar27 = *puVar44 * -0x30e44323405a9d00 >> (bVar14 & 0x3f);
        local_e8 = puVar44 + 0x10;
        uVar20 = (ulong)pUVar5[uVar27];
        uVar21 = (uint)puVar37;
        lVar33 = -(long)puVar37;
        local_a0 = (ulong *)0x2;
        uVar40 = (ulong)(*(long *)((long)puVar44 + 1) * -0x30e44323405a9d00) >> (bVar14 & 0x3f);
        puVar25 = (ulong *)((long)puVar44 + 2);
        while( true ) {
          uVar22 = (int)puVar44 - iVar43;
          uVar15 = *(uint *)((long)puVar25 + lVar33);
          pUVar5[uVar27] = uVar22;
          iVar32 = (int)puVar17;
          puVar13 = puVar25;
          puVar18 = puVar35;
          if ((uVar21 == 0) || ((uint)*puVar25 != uVar15)) {
            if ((uint)uVar20 < uVar23) {
              uVar15 = (uint)*puVar44 ^ 1;
            }
            else {
              uVar15 = *(uint *)(pBVar6 + uVar20);
            }
            if ((uint)*puVar44 == uVar15) {
              pUVar5[uVar40] = iVar32 - iVar43;
              iVar32 = 9;
            }
            else {
              uVar15 = pUVar5[uVar40];
              uVar20 = (ulong)uVar15;
              uVar24 = *puVar25 * -0x30e44323405a9d00 >> (bVar14 & 0x3f);
              uVar22 = iVar32 - iVar43;
              pUVar5[uVar40] = uVar22;
              if (uVar15 < uVar23) {
                uVar15 = (uint)*puVar17 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar6 + uVar20);
              }
              if ((uint)*puVar17 == uVar15) {
                iVar32 = 9;
                puVar13 = puVar35;
                puVar44 = puVar17;
                uVar27 = uVar40;
                uVar40 = uVar24;
                puVar17 = puVar25;
                if (local_a0 < 5) {
                  pUVar5[uVar24] = (int)puVar25 - iVar43;
                }
              }
              else {
                uVar20 = (ulong)pUVar5[uVar24];
                uVar40 = *puVar35 * -0x30e44323405a9d00 >> (bVar14 & 0x3f);
                puVar13 = (ulong *)((long)puVar25 + (long)local_a0);
                puVar18 = (ulong *)((long)puVar35 + (long)local_a0);
                iVar32 = 0;
                puVar44 = puVar25;
                uVar27 = uVar24;
                puVar17 = puVar35;
                if (local_e8 <= puVar13) {
                  local_a0 = (ulong *)((long)local_a0 + 1);
                  local_e8 = local_e8 + 0x10;
                }
              }
            }
          }
          else {
            uVar24 = (ulong)(*(char *)((long)puVar25 + -1) == *(char *)((long)puVar25 + lVar33 + -1)
                            );
            puVar44 = (ulong *)((long)puVar25 - uVar24);
            pBVar38 = (BYTE *)((long)puVar25 + (lVar33 - uVar24));
            puVar42 = (undefined1 *)(uVar24 | 4);
            pUVar5[uVar40] = iVar32 - iVar43;
            iVar32 = 8;
            local_78 = &DAT_00000001;
          }
          puVar35 = puVar18;
          if (iVar32 != 0) break;
          puVar25 = puVar13;
          if (puVar10 <= puVar35) goto LAB_01db74e3;
        }
        if (iVar32 == 8) {
          local_c0 = (BYTE *)(ulong)local_70;
          pBVar12 = (BYTE *)puVar37;
        }
        else {
          pBVar38 = pBVar6 + uVar20;
          uVar15 = (int)puVar44 - (int)pBVar38;
          pBVar12 = (BYTE *)(ulong)uVar15;
          local_78 = (BYTE *)(ulong)(uVar15 + 3);
          puVar42 = (undefined1 *)0x4;
          local_c0 = (BYTE *)puVar37;
          if ((uVar23 < (uint)uVar20) && (local_d8 < puVar44)) {
            pBVar11 = pBVar6 + (uVar20 - 1);
            puVar35 = puVar44;
            while (pBVar38 = pBVar11, puVar44 = (ulong *)((long)puVar35 + -1),
                  *(BYTE *)puVar44 == *pBVar38) {
              puVar42 = puVar42 + 1;
              if ((puVar44 <= local_d8) ||
                 (pBVar11 = pBVar38 + -1, puVar35 = puVar44, pBVar38 <= pBVar34)) goto LAB_01db47fe;
            }
            pBVar38 = pBVar38 + 1;
            puVar44 = puVar35;
          }
        }
LAB_01db47fe:
        puVar35 = (ulong *)((long)puVar44 + (long)puVar42);
        puVar37 = (ulong *)(pBVar38 + (long)puVar42);
        puVar17 = puVar35;
        if (puVar35 < puVar1) {
          uVar40 = *puVar35 ^ *puVar37;
          uVar27 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          puVar31 = (undefined1 *)(uVar27 >> 3 & 0x1fffffff);
          if (*puVar37 == *puVar35) {
            do {
              puVar17 = puVar17 + 1;
              puVar37 = puVar37 + 1;
              if (puVar1 <= puVar17) goto LAB_01db4870;
              uVar40 = *puVar17 ^ *puVar37;
              uVar27 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              puVar31 = (undefined1 *)((long)puVar17 + ((uVar27 >> 3 & 0x1fffffff) - (long)puVar35))
              ;
            } while (*puVar37 == *puVar17);
          }
        }
        else {
LAB_01db4870:
          if ((puVar17 < (ulong *)((long)puVar2 + -3)) && ((uint)*puVar37 == (uint)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 4);
            puVar37 = (ulong *)((long)puVar37 + 4);
          }
          if ((puVar17 < (ulong *)((long)puVar2 + -1)) && ((short)*puVar37 == (short)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 2);
            puVar37 = (ulong *)((long)puVar37 + 2);
          }
          if (puVar17 < puVar2) {
            puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar37 == (char)*puVar17));
          }
          puVar31 = (undefined1 *)((long)puVar17 - (long)puVar35);
        }
        uVar27 = (long)puVar44 - (long)local_d8;
        puVar35 = (ulong *)seqStore->lit;
        if (puVar16 < puVar44) {
          ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)local_d8,(BYTE *)puVar44,(BYTE *)puVar16);
        }
        else {
          uVar40 = local_d8[1];
          *puVar35 = *local_d8;
          puVar35[1] = uVar40;
          if (0x10 < uVar27) {
            pBVar11 = seqStore->lit;
            uVar40 = local_d8[3];
            *(ulong *)(pBVar11 + 0x10) = local_d8[2];
            *(ulong *)(pBVar11 + 0x18) = uVar40;
            if (0x20 < (long)uVar27) {
              lVar33 = 0;
              do {
                puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x20);
                uVar8 = puVar4[1];
                pBVar3 = pBVar11 + lVar33 + 0x20;
                *(undefined8 *)pBVar3 = *puVar4;
                *(undefined8 *)(pBVar3 + 8) = uVar8;
                puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x30);
                uVar8 = puVar4[1];
                *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar3 + 0x18) = uVar8;
                lVar33 = lVar33 + 0x20;
              } while (pBVar3 + 0x20 < pBVar11 + uVar27);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar27;
        if (0xffff < uVar27) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        puVar42 = puVar31 + (long)puVar42;
        psVar7 = seqStore->sequences;
        psVar7->litLength = (U16)uVar27;
        psVar7->offBase = (U32)local_78;
        if ((undefined1 *)0xffff < puVar42 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar7->mlBase = (U16)(puVar42 + -3);
        seqStore->sequences = psVar7 + 1;
        local_d8 = (ulong *)((long)puVar44 + (long)puVar42);
        puVar37 = (ulong *)pBVar12;
        if (local_d8 <= puVar10) {
          pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar22 + 2) * -0x30e44323405a9d00) >>
                 (bVar14 & 0x3f)] = uVar22 + 2;
          pUVar5[(ulong)(*(long *)((long)local_d8 + -2) * -0x30e44323405a9d00) >> (bVar14 & 0x3f)] =
               ((int)local_d8 + -2) - iVar43;
          if ((uint)local_c0 == 0) {
            local_c0._0_4_ = 0;
          }
          else {
            do {
              pBVar11 = (BYTE *)(ulong)(uint)local_c0;
              uVar15 = (uint)pBVar12;
              puVar37 = (ulong *)pBVar12;
              if ((uint)*local_d8 != *(uint *)((long)local_d8 - (long)pBVar11)) break;
              puVar44 = (ulong *)((long)local_d8 + 4);
              puVar37 = (ulong *)((long)local_d8 + (4 - (long)pBVar11));
              puVar35 = puVar44;
              if (puVar44 < puVar1) {
                uVar40 = *puVar44 ^ *puVar37;
                uVar27 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                puVar31 = (undefined1 *)(uVar27 >> 3 & 0x1fffffff);
                if (*puVar37 == *puVar44) {
                  puVar35 = (ulong *)((long)local_d8 + 0xc);
                  puVar37 = (ulong *)((long)local_d8 + (0xc - (long)pBVar11));
                  do {
                    if (puVar1 <= puVar35) goto LAB_01db4a8f;
                    uVar27 = *puVar37;
                    uVar40 = *puVar35;
                    uVar24 = uVar40 ^ uVar27;
                    uVar20 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    puVar31 = (undefined1 *)
                              ((long)puVar35 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar44));
                    puVar35 = puVar35 + 1;
                    puVar37 = puVar37 + 1;
                  } while (uVar27 == uVar40);
                }
              }
              else {
LAB_01db4a8f:
                if ((puVar35 < (ulong *)((long)puVar2 + -3)) && ((uint)*puVar37 == (uint)*puVar35))
                {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar35 < (ulong *)((long)puVar2 + -1)) && ((short)*puVar37 == (short)*puVar35)
                   ) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar35 < puVar2) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar37 == (char)*puVar35));
                }
                puVar31 = (undefined1 *)((long)puVar35 - (long)puVar44);
              }
              pUVar5[*local_d8 * -0x30e44323405a9d00 >> (bVar14 & 0x3f)] = (int)local_d8 - iVar43;
              puVar44 = (ulong *)seqStore->lit;
              if (puVar16 < local_d8) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar44,(BYTE *)local_d8,(BYTE *)local_d8,(BYTE *)puVar16);
              }
              else {
                uVar27 = local_d8[1];
                *puVar44 = *local_d8;
                puVar44[1] = uVar27;
              }
              psVar7 = seqStore->sequences;
              psVar7->litLength = 0;
              psVar7->offBase = 1;
              if ((undefined1 *)0xffff < puVar31 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
              }
              local_d8 = (ulong *)((long)local_d8 + (long)(puVar31 + 4));
              psVar7->mlBase = (U16)(puVar31 + 1);
              seqStore->sequences = psVar7 + 1;
              pBVar12 = pBVar11;
              puVar37 = (ulong *)pBVar11;
              local_c0._0_4_ = uVar15;
            } while (local_d8 <= puVar10);
          }
        }
        puVar35 = (ulong *)((long)local_d8 + 3);
        uVar21 = (uint)puVar37;
        puVar44 = local_d8;
        local_70 = (uint)local_c0;
      } while (puVar35 < puVar10);
    }
  }
  else if (puVar35 < puVar10) {
    bVar14 = 0x20 - (char)(ms->cParams).hashLog;
    puVar1 = (ulong *)((long)puVar2 + -7);
    puVar16 = puVar2 + -4;
    pBVar38 = (BYTE *)puVar37;
    do {
      uVar27 = (ulong)((uint)*puVar44 * -0x61c8864f >> (bVar14 & 0x1f));
      local_e8 = puVar44 + 0x10;
      uVar20 = (ulong)pUVar5[uVar27];
      uVar21 = (uint)pBVar38;
      lVar33 = -(long)pBVar38;
      local_a0 = (ulong *)0x2;
      uVar40 = (ulong)((uint)(*(int *)((long)puVar44 + 1) * -0x61c8864f) >> (bVar14 & 0x1f));
      puVar17 = (ulong *)((long)puVar44 + 2);
      puVar25 = (ulong *)((long)puVar44 + 1);
      while( true ) {
        uVar22 = (int)puVar44 - iVar43;
        uVar15 = *(uint *)((long)puVar17 + lVar33);
        pUVar5[uVar27] = uVar22;
        iVar32 = (int)puVar25;
        puVar13 = puVar17;
        puVar18 = puVar35;
        if ((uVar21 == 0) || ((uint)*puVar17 != uVar15)) {
          if ((uint)uVar20 < uVar23) {
            uVar15 = (uint)*puVar44 ^ 1;
          }
          else {
            uVar15 = *(uint *)(pBVar6 + uVar20);
          }
          if ((uint)*puVar44 == uVar15) {
            pUVar5[uVar40] = iVar32 - iVar43;
            iVar32 = 9;
          }
          else {
            uVar15 = pUVar5[uVar40];
            uVar20 = (ulong)uVar15;
            uVar24 = (ulong)((uint)*puVar17 * -0x61c8864f >> (bVar14 & 0x1f));
            uVar22 = iVar32 - iVar43;
            pUVar5[uVar40] = uVar22;
            if (uVar15 < uVar23) {
              uVar15 = (uint)*puVar25 ^ 1;
            }
            else {
              uVar15 = *(uint *)(pBVar6 + uVar20);
            }
            if ((uint)*puVar25 == uVar15) {
              iVar32 = 9;
              puVar13 = puVar35;
              puVar44 = puVar25;
              uVar27 = uVar40;
              uVar40 = uVar24;
              puVar25 = puVar17;
              if (local_a0 < 5) {
                pUVar5[uVar24] = (int)puVar17 - iVar43;
              }
            }
            else {
              uVar20 = (ulong)pUVar5[uVar24];
              uVar40 = (ulong)((uint)*puVar35 * -0x61c8864f >> (bVar14 & 0x1f));
              puVar13 = (ulong *)((long)puVar17 + (long)local_a0);
              puVar18 = (ulong *)((long)puVar35 + (long)local_a0);
              iVar32 = 0;
              puVar44 = puVar17;
              uVar27 = uVar24;
              puVar25 = puVar35;
              if (local_e8 <= puVar13) {
                local_a0 = (ulong *)((long)local_a0 + 1);
                local_e8 = local_e8 + 0x10;
              }
            }
          }
        }
        else {
          uVar24 = (ulong)(*(char *)((long)puVar17 + -1) == *(char *)((long)puVar17 + lVar33 + -1));
          puVar44 = (ulong *)((long)puVar17 - uVar24);
          local_c8 = (ulong *)((long)puVar17 + (lVar33 - uVar24));
          puVar37 = (ulong *)(uVar24 | 4);
          pUVar5[uVar40] = iVar32 - iVar43;
          iVar32 = 8;
          local_78 = &DAT_00000001;
        }
        puVar35 = puVar18;
        if (iVar32 != 0) break;
        puVar17 = puVar13;
        if (puVar10 <= puVar35) goto LAB_01db74e3;
      }
      if (iVar32 == 8) {
        local_c0 = (BYTE *)(ulong)local_70;
        local_e8 = (ulong *)pBVar38;
      }
      else {
        local_c8 = (ulong *)(pBVar6 + uVar20);
        uVar15 = (int)puVar44 - (int)local_c8;
        local_e8 = (ulong *)(ulong)uVar15;
        local_78 = (BYTE *)(ulong)(uVar15 + 3);
        puVar37 = (ulong *)0x4;
        local_c0 = pBVar38;
        if ((uVar23 < (uint)uVar20) && (local_d8 < puVar44)) {
          pBVar38 = pBVar6 + (uVar20 - 1);
          puVar35 = puVar44;
          while (local_c8 = (ulong *)pBVar38, puVar44 = (ulong *)((long)puVar35 + -1),
                *(BYTE *)puVar44 == *(BYTE *)local_c8) {
            puVar37 = (ulong *)((long)puVar37 + 1);
            if ((puVar44 <= local_d8) ||
               (pBVar38 = (BYTE *)((long)local_c8 + -1), puVar35 = puVar44, local_c8 <= pBVar34))
            goto LAB_01db70b3;
          }
          local_c8 = (ulong *)((long)local_c8 + 1);
          puVar44 = puVar35;
        }
      }
LAB_01db70b3:
      puVar35 = (ulong *)((long)puVar44 + (long)puVar37);
      puVar17 = (ulong *)((long)local_c8 + (long)puVar37);
      puVar25 = puVar35;
      if (puVar35 < puVar1) {
        uVar40 = *puVar35 ^ *puVar17;
        uVar27 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
        puVar42 = (undefined1 *)(uVar27 >> 3 & 0x1fffffff);
        if (*puVar17 == *puVar35) {
          do {
            puVar25 = puVar25 + 1;
            puVar17 = puVar17 + 1;
            if (puVar1 <= puVar25) goto LAB_01db712a;
            uVar40 = *puVar25 ^ *puVar17;
            uVar27 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
              }
            }
            puVar42 = (undefined1 *)((long)puVar25 + ((uVar27 >> 3 & 0x1fffffff) - (long)puVar35));
          } while (*puVar17 == *puVar25);
        }
      }
      else {
LAB_01db712a:
        if ((puVar25 < (ulong *)((long)puVar2 + -3)) && ((uint)*puVar17 == (uint)*puVar25)) {
          puVar25 = (ulong *)((long)puVar25 + 4);
          puVar17 = (ulong *)((long)puVar17 + 4);
        }
        if ((puVar25 < (ulong *)((long)puVar2 + -1)) && ((short)*puVar17 == (short)*puVar25)) {
          puVar25 = (ulong *)((long)puVar25 + 2);
          puVar17 = (ulong *)((long)puVar17 + 2);
        }
        if (puVar25 < puVar2) {
          puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar17 == (char)*puVar25));
        }
        puVar42 = (undefined1 *)((long)puVar25 - (long)puVar35);
      }
      uVar27 = (long)puVar44 - (long)local_d8;
      puVar35 = (ulong *)seqStore->lit;
      if (puVar16 < puVar44) {
        ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)local_d8,(BYTE *)puVar44,(BYTE *)puVar16);
      }
      else {
        uVar40 = local_d8[1];
        *puVar35 = *local_d8;
        puVar35[1] = uVar40;
        if (0x10 < uVar27) {
          pBVar38 = seqStore->lit;
          uVar40 = local_d8[3];
          *(ulong *)(pBVar38 + 0x10) = local_d8[2];
          *(ulong *)(pBVar38 + 0x18) = uVar40;
          if (0x20 < (long)uVar27) {
            lVar33 = 0;
            do {
              puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x20);
              uVar8 = puVar4[1];
              pBVar12 = pBVar38 + lVar33 + 0x20;
              *(undefined8 *)pBVar12 = *puVar4;
              *(undefined8 *)(pBVar12 + 8) = uVar8;
              puVar4 = (undefined8 *)((long)local_d8 + lVar33 + 0x30);
              uVar8 = puVar4[1];
              *(undefined8 *)(pBVar12 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar12 + 0x18) = uVar8;
              lVar33 = lVar33 + 0x20;
            } while (pBVar12 + 0x20 < pBVar38 + uVar27);
          }
        }
      }
      seqStore->lit = seqStore->lit + uVar27;
      if (0xffff < uVar27) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      puVar37 = (ulong *)((long)puVar37 + (long)puVar42);
      psVar7 = seqStore->sequences;
      psVar7->litLength = (U16)uVar27;
      psVar7->offBase = (U32)local_78;
      if ((BYTE *)0xffff < (BYTE *)((long)puVar37 + -3)) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar7->mlBase = (U16)(BYTE *)((long)puVar37 + -3);
      seqStore->sequences = psVar7 + 1;
      local_d8 = (ulong *)((long)puVar44 + (long)puVar37);
      if (local_d8 <= puVar10) {
        pUVar5[(uint)(*(int *)(pBVar6 + (ulong)uVar22 + 2) * -0x61c8864f) >> (bVar14 & 0x1f)] =
             uVar22 + 2;
        pUVar5[(uint)(*(int *)((long)local_d8 + -2) * -0x61c8864f) >> (bVar14 & 0x1f)] =
             ((int)local_d8 + -2) - iVar43;
        pBVar38 = local_c0;
        if ((uint)local_c0 == 0) {
          local_c0._0_4_ = 0;
        }
        else {
          do {
            pBVar12 = pBVar38;
            uVar15 = (uint)local_e8;
            local_c0._0_4_ = (uint)pBVar12;
            if ((uint)*local_d8 != *(uint *)((long)local_d8 - (long)pBVar12)) break;
            puVar44 = (ulong *)((long)local_d8 + 4);
            puVar17 = (ulong *)((long)local_d8 + (4 - (long)pBVar12));
            puVar35 = puVar44;
            if (puVar44 < puVar1) {
              uVar40 = *puVar44 ^ *puVar17;
              uVar27 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              puVar42 = (undefined1 *)(uVar27 >> 3 & 0x1fffffff);
              if (*puVar17 == *puVar44) {
                puVar35 = (ulong *)((long)local_d8 + 0xc);
                puVar17 = (ulong *)((long)local_d8 + (0xc - (long)pBVar12));
                do {
                  if (puVar1 <= puVar35) goto LAB_01db734f;
                  uVar27 = *puVar17;
                  uVar40 = *puVar35;
                  uVar24 = uVar40 ^ uVar27;
                  uVar20 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  puVar42 = (undefined1 *)
                            ((long)puVar35 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar44));
                  puVar35 = puVar35 + 1;
                  puVar17 = puVar17 + 1;
                } while (uVar27 == uVar40);
              }
            }
            else {
LAB_01db734f:
              if ((puVar35 < (ulong *)((long)puVar2 + -3)) && ((uint)*puVar17 == (uint)*puVar35)) {
                puVar35 = (ulong *)((long)puVar35 + 4);
                puVar17 = (ulong *)((long)puVar17 + 4);
              }
              if ((puVar35 < (ulong *)((long)puVar2 + -1)) && ((short)*puVar17 == (short)*puVar35))
              {
                puVar35 = (ulong *)((long)puVar35 + 2);
                puVar17 = (ulong *)((long)puVar17 + 2);
              }
              if (puVar35 < puVar2) {
                puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar17 == (char)*puVar35));
              }
              puVar42 = (undefined1 *)((long)puVar35 - (long)puVar44);
            }
            pUVar5[(uint)*local_d8 * -0x61c8864f >> (bVar14 & 0x1f)] = (int)local_d8 - iVar43;
            puVar44 = (ulong *)seqStore->lit;
            if (puVar16 < local_d8) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar44,(BYTE *)local_d8,(BYTE *)local_d8,(BYTE *)puVar16);
            }
            else {
              uVar27 = local_d8[1];
              *puVar44 = *local_d8;
              puVar44[1] = uVar27;
            }
            psVar7 = seqStore->sequences;
            psVar7->litLength = 0;
            psVar7->offBase = 1;
            if ((undefined1 *)0xffff < puVar42 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
            }
            local_d8 = (ulong *)((long)local_d8 + (long)(puVar42 + 4));
            psVar7->mlBase = (U16)(puVar42 + 1);
            seqStore->sequences = psVar7 + 1;
            pBVar38 = (BYTE *)local_e8;
            local_e8 = (ulong *)pBVar12;
            local_c0._0_4_ = uVar15;
          } while (local_d8 <= puVar10);
        }
      }
      puVar35 = (ulong *)((long)local_d8 + 3);
      uVar21 = (uint)local_e8;
      pBVar38 = (BYTE *)local_e8;
      puVar44 = local_d8;
      local_70 = (uint)local_c0;
    } while (puVar35 < puVar10);
  }
LAB_01db74e3:
  if (uVar19 <= uVar36) {
    uVar19 = 0;
  }
  uVar15 = uVar19;
  if (uVar21 != 0) {
    uVar15 = uVar9;
  }
  if (uVar9 <= uVar36) {
    uVar15 = uVar19;
    uVar9 = 0;
  }
  if (uVar21 != 0) {
    uVar9 = uVar21;
  }
  *rep = uVar9;
  if (local_70 != 0) {
    uVar15 = local_70;
  }
  goto LAB_01db752c;
LAB_01db6d72:
LAB_01db6d7e:
  if (uVar23 <= uVar21) {
    uVar23 = 0;
  }
  uVar15 = uVar23;
  if (uVar36 != 0) {
    uVar15 = uVar9;
  }
  if (uVar9 <= uVar21) {
    uVar15 = uVar23;
    uVar9 = 0;
  }
  if (uVar36 != 0) {
    uVar9 = uVar36;
  }
  *rep = uVar9;
  if ((uint)local_98 != 0) {
    uVar15 = (uint)local_98;
  }
LAB_01db752c:
  rep[1] = uVar15;
LAB_01db752f:
  return (long)src + (srcSize - (long)local_d8);
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    if (ms->cParams.targetLength > 1) {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_1(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_1(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_1(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_1(ms, seqStore, rep, src, srcSize);
        }
    } else {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_0(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_0(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_0(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_0(ms, seqStore, rep, src, srcSize);
        }

    }
}